

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAPITexParam::Run(BasicAPITexParam *this)

{
  CallLogWrapper *this_00;
  GLint i;
  GLuint ui;
  GLfloat f;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_texture);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8230,0x10,0x10,0,0x1903,0x1406,(void *)0x0);
  glu::CallLogWrapper::glGetTexParameteriv(this_00,0xde1,0x90c7,&i);
  if ((((i == 0x90c8) &&
       (glu::CallLogWrapper::glGetTexParameterfv(this_00,0xde1,0x90c7,&f), (int)(long)f == 0x90c8))
      && (glu::CallLogWrapper::glGetTexParameterIiv(this_00,0xde1,0x90c7,&i), i == 0x90c8)) &&
     (glu::CallLogWrapper::glGetTexParameterIuiv(this_00,0xde1,0x90c7,&ui), ui == 0x90c8)) {
    return 0;
  }
  anon_unknown_0::Output
            (
            "GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL."
            );
  return -1;
}

Assistant:

virtual long Run()
	{
		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RG32F, 16, 16, 0, GL_RED, GL_FLOAT, NULL);

		GLint   i;
		GLfloat f;
		GLuint  ui;

		glGetTexParameteriv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &i);
		if (i != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}
		glGetTexParameterfv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &f);
		if (static_cast<GLenum>(f) != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}
		glGetTexParameterIiv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &i);
		if (i != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}
		glGetTexParameterIuiv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &ui);
		if (ui != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}

		return NO_ERROR;
	}